

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QVariant>>
          (QtPrivate *this,QDebug debug,char *which,QList<QVariant> *c)

{
  char *pcVar1;
  long lVar2;
  storage_type *psVar3;
  storage_type *psVar4;
  QArrayData *this_00;
  QTextStream *pQVar5;
  QVariant *pQVar6;
  QVariant *pQVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebugStateSaver saver;
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  undefined1 *local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar5 = *(QTextStream **)debug.stream;
  pQVar5[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar4 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar4 = psVar3 + 1;
      pcVar1 = which + 1 + (long)psVar3;
      psVar3 = psVar4;
    } while (*pcVar1 != '\0');
  }
  QVar8.m_data = psVar4;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar5,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar5 = *(QTextStream **)debug.stream;
  if (pQVar5[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar5,' ');
    pQVar5 = *(QTextStream **)debug.stream;
  }
  QTextStream::operator<<(pQVar5,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar7 = (c->d).ptr;
  lVar2 = (c->d).size;
  pQVar6 = pQVar7 + lVar2;
  if (lVar2 != 0) {
    local_50.d.d = *(Data **)debug.stream;
    *(int *)&(&(local_50.d.d)->super_QArrayData)[2].alloc =
         (int)(&(local_50.d.d)->super_QArrayData)[2].alloc + 1;
    QVariant::qdebugHelper((Stream *)local_60);
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug((QDebug *)local_60);
    pQVar7 = pQVar7 + 1;
  }
  if (pQVar7 != pQVar6) {
    do {
      pQVar5 = *(QTextStream **)debug.stream;
      QVar9.m_data = (storage_type *)0x2;
      QVar9.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<(pQVar5,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00 = *(QArrayData **)debug.stream;
      if ((char)this_00[3].ref_._q_value.super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)this_00,' ');
        this_00 = *(QArrayData **)debug.stream;
      }
      *(int *)&this_00[2].alloc = (int)this_00[2].alloc + 1;
      local_50.d.d = (Data *)this_00;
      QVariant::qdebugHelper((Stream *)local_68);
      QDebug::~QDebug((QDebug *)&local_50);
      QDebug::~QDebug((QDebug *)local_68);
      pQVar7 = pQVar7 + 1;
    } while (pQVar7 != pQVar6);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar5 = *(QTextStream **)debug.stream;
  if (pQVar5[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar5,' ');
    pQVar5 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar5;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}